

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask.c
# Opt level: O3

void aom_highbd_blend_a64_mask_c
               (uint8_t *dst_8,uint32_t dst_stride,uint8_t *src0_8,uint32_t src0_stride,
               uint8_t *src1_8,uint32_t src1_stride,uint8_t *mask,uint32_t mask_stride,int w,int h,
               int subw,int subh,int bd)

{
  long lVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  long lVar17;
  uint local_50;
  uint local_4c;
  uint local_48;
  
  lVar1 = (long)dst_8 * 2;
  lVar2 = (long)src0_8 * 2;
  lVar3 = (long)src1_8 * 2;
  if (subh == 0 && subw == 0) {
    if (0 < h) {
      local_4c = 0;
      local_50 = 0;
      uVar8 = 0;
      uVar10 = 0;
      iVar15 = 0;
      do {
        iVar5 = (int)uVar8;
        if (0 < w) {
          uVar7 = (ulong)(uint)w;
          uVar12 = local_4c;
          uVar6 = local_50;
          uVar16 = uVar10;
          do {
            *(short *)(lVar1 + (ulong)uVar16 * 2) =
                 (short)((uint)*(ushort *)(lVar2 + (ulong)uVar6 * 2) * (uint)mask[uVar12] +
                         (uint)*(ushort *)(lVar3 + uVar8 * 2) * (0x40 - (uint)mask[uVar12]) + 0x20
                        >> 6);
            uVar16 = uVar16 + 1;
            uVar8 = (ulong)((int)uVar8 + 1);
            uVar6 = uVar6 + 1;
            uVar12 = uVar12 + 1;
            uVar7 = uVar7 - 1;
          } while (uVar7 != 0);
        }
        iVar15 = iVar15 + 1;
        uVar10 = uVar10 + dst_stride;
        uVar8 = (ulong)(iVar5 + src1_stride);
        local_50 = local_50 + src0_stride;
        local_4c = local_4c + mask_stride;
      } while (iVar15 != h);
    }
  }
  else if (subh == 1 && (subw ^ 1U) == 0) {
    if (0 < h) {
      iVar15 = mask_stride * 2;
      iVar14 = 0;
      local_50 = 0;
      local_4c = 0;
      local_48 = 0;
      iVar5 = 0;
      do {
        if (0 < w) {
          lVar17 = 0;
          uVar10 = local_50;
          uVar16 = local_4c;
          uVar12 = local_48;
          do {
            iVar4 = (int)lVar17;
            uVar6 = (uint)mask[mask_stride + iVar4 + 1] +
                    (uint)mask[iVar14 + iVar4 + 1] +
                    (uint)mask[mask_stride + iVar4] + (uint)mask[(uint)(iVar14 + iVar4)] + 2 >> 2;
            *(short *)(lVar1 + (ulong)uVar12 * 2) =
                 (short)((uint)*(ushort *)(lVar3 + (ulong)uVar16 * 2) * (0x40 - uVar6) +
                         *(ushort *)(lVar2 + (ulong)uVar10 * 2) * uVar6 + 0x20 >> 6);
            uVar12 = uVar12 + 1;
            uVar16 = uVar16 + 1;
            uVar10 = uVar10 + 1;
            lVar17 = lVar17 + 2;
          } while ((ulong)(uint)w * 2 != lVar17);
        }
        iVar5 = iVar5 + 1;
        local_48 = local_48 + dst_stride;
        local_4c = local_4c + src1_stride;
        local_50 = local_50 + src0_stride;
        iVar14 = iVar14 + iVar15;
        mask_stride = mask_stride + iVar15;
      } while (iVar5 != h);
    }
  }
  else if ((subw ^ 1U) == 0 && subh == 0) {
    if (0 < h) {
      local_50 = 0;
      local_4c = 0;
      uVar8 = 0;
      uVar10 = 0;
      iVar15 = 0;
      do {
        iVar5 = (int)uVar8;
        if (0 < w) {
          uVar7 = (ulong)(uint)w;
          uVar16 = local_50;
          uVar12 = local_4c;
          uVar6 = uVar10;
          do {
            uVar13 = (uint)mask[uVar6 + 1] + (uint)mask[uVar6] + 1 >> 1 & 0xff;
            *(short *)(lVar1 + uVar8 * 2) =
                 (short)((uint)*(ushort *)(lVar3 + (ulong)uVar12 * 2) * (0x40 - uVar13) +
                         *(ushort *)(lVar2 + (ulong)uVar16 * 2) * uVar13 + 0x20 >> 6);
            uVar6 = uVar6 + 2;
            uVar8 = (ulong)((int)uVar8 + 1);
            uVar12 = uVar12 + 1;
            uVar16 = uVar16 + 1;
            uVar7 = uVar7 - 1;
          } while (uVar7 != 0);
        }
        iVar15 = iVar15 + 1;
        uVar10 = uVar10 + mask_stride;
        uVar8 = (ulong)(iVar5 + dst_stride);
        local_4c = local_4c + src1_stride;
        local_50 = local_50 + src0_stride;
      } while (iVar15 != h);
    }
  }
  else if (0 < h) {
    local_50 = 0;
    local_4c = 0;
    uVar10 = 0;
    uVar16 = 0;
    iVar15 = 0;
    do {
      if (0 < w) {
        uVar8 = (ulong)(uint)w;
        uVar13 = local_50;
        uVar11 = local_4c;
        uVar12 = uVar16;
        uVar6 = uVar10;
        do {
          uVar9 = (uint)mask[uVar13] + (uint)mask[mask_stride + uVar13] + 1 >> 1 & 0xff;
          *(short *)(lVar1 + (ulong)uVar12 * 2) =
               (short)((uint)*(ushort *)(lVar3 + (ulong)uVar6 * 2) * (0x40 - uVar9) +
                       *(ushort *)(lVar2 + (ulong)uVar11 * 2) * uVar9 + 0x20 >> 6);
          uVar12 = uVar12 + 1;
          uVar6 = uVar6 + 1;
          uVar11 = uVar11 + 1;
          uVar13 = uVar13 + 1;
          uVar8 = uVar8 - 1;
        } while (uVar8 != 0);
      }
      iVar15 = iVar15 + 1;
      uVar16 = uVar16 + dst_stride;
      uVar10 = uVar10 + src1_stride;
      local_4c = local_4c + src0_stride;
      local_50 = local_50 + mask_stride * 2;
    } while (iVar15 != h);
  }
  return;
}

Assistant:

void aom_highbd_blend_a64_mask_c(uint8_t *dst_8, uint32_t dst_stride,
                                 const uint8_t *src0_8, uint32_t src0_stride,
                                 const uint8_t *src1_8, uint32_t src1_stride,
                                 const uint8_t *mask, uint32_t mask_stride,
                                 int w, int h, int subw, int subh, int bd) {
  int i, j;
  uint16_t *dst = CONVERT_TO_SHORTPTR(dst_8);
  const uint16_t *src0 = CONVERT_TO_SHORTPTR(src0_8);
  const uint16_t *src1 = CONVERT_TO_SHORTPTR(src1_8);
  (void)bd;

  assert(IMPLIES(src0 == dst, src0_stride == dst_stride));
  assert(IMPLIES(src1 == dst, src1_stride == dst_stride));

  assert(h >= 1);
  assert(w >= 1);
  assert(IS_POWER_OF_TWO(h));
  assert(IS_POWER_OF_TWO(w));

  assert(bd == 8 || bd == 10 || bd == 12);

  if (subw == 0 && subh == 0) {
    for (i = 0; i < h; ++i) {
      for (j = 0; j < w; ++j) {
        const int m = mask[i * mask_stride + j];
        dst[i * dst_stride + j] = AOM_BLEND_A64(m, src0[i * src0_stride + j],
                                                src1[i * src1_stride + j]);
      }
    }
  } else if (subw == 1 && subh == 1) {
    for (i = 0; i < h; ++i) {
      for (j = 0; j < w; ++j) {
        const int m = ROUND_POWER_OF_TWO(
            mask[(2 * i) * mask_stride + (2 * j)] +
                mask[(2 * i + 1) * mask_stride + (2 * j)] +
                mask[(2 * i) * mask_stride + (2 * j + 1)] +
                mask[(2 * i + 1) * mask_stride + (2 * j + 1)],
            2);
        dst[i * dst_stride + j] = AOM_BLEND_A64(m, src0[i * src0_stride + j],
                                                src1[i * src1_stride + j]);
      }
    }
  } else if (subw == 1 && subh == 0) {
    for (i = 0; i < h; ++i) {
      for (j = 0; j < w; ++j) {
        const int m = AOM_BLEND_AVG(mask[i * mask_stride + (2 * j)],
                                    mask[i * mask_stride + (2 * j + 1)]);
        dst[i * dst_stride + j] = AOM_BLEND_A64(m, src0[i * src0_stride + j],
                                                src1[i * src1_stride + j]);
      }
    }
  } else {
    for (i = 0; i < h; ++i) {
      for (j = 0; j < w; ++j) {
        const int m = AOM_BLEND_AVG(mask[(2 * i) * mask_stride + j],
                                    mask[(2 * i + 1) * mask_stride + j]);
        dst[i * dst_stride + j] = AOM_BLEND_A64(m, src0[i * src0_stride + j],
                                                src1[i * src1_stride + j]);
      }
    }
  }
}